

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flowtest.cc
# Opt level: O1

void __thiscall flowtest::Lexer::skipSpace(Lexer *this)

{
  char cVar1;
  ulong uVar2;
  
  while( true ) {
    uVar2 = (ulong)(this->currentPos_).offset;
    cVar1 = -1;
    if ((this->source_)._M_string_length != uVar2) {
      cVar1 = (this->source_)._M_dataplus._M_p[uVar2];
    }
    if ((cVar1 != ' ') && (cVar1 != '\t')) break;
    nextChar(this,1);
  }
  return;
}

Assistant:

void Lexer::skipSpace() {
  for (;;) {
    switch (currentChar()) {
      case ' ':
      case '\t':
        nextChar();
        break;
      default:
        return;
    }
  }
}